

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O2

void __thiscall Shell::parseAssertReturn(Shell *this,Element *s)

{
  bool bVar1;
  size_t sVar2;
  mapped_type *pmVar3;
  Element *pEVar4;
  ostream *poVar5;
  SmallVector<wasm::Literal,_1UL> in_stack_fffffffffffffd68;
  SmallVector<wasm::Literal,_1UL> local_108;
  SmallVector<wasm::Literal,_1UL> local_d0;
  undefined1 auStack_98 [8];
  Literals actual;
  undefined1 auStack_58 [8];
  Literals expected;
  
  actual.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  actual.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  actual.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  actual.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  actual.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_98 = (undefined1  [8])0x0;
  actual.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  expected.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  expected.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  expected.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  expected.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_58 = (undefined1  [8])0x0;
  expected.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  expected.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sVar2 = ::wasm::Element::size(s);
  if (2 < sVar2) {
    pmVar3 = std::
             map<wasm::Name,_std::shared_ptr<wasm::SExpressionWasmBuilder>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::SExpressionWasmBuilder>_>_>_>
             ::operator[](&this->builders,&this->lastModule);
    pEVar4 = (Element *)
             (pmVar3->super___shared_ptr<wasm::SExpressionWasmBuilder,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    ::wasm::Element::operator[]((uint)s);
    ::wasm::SExpressionWasmBuilder::parseExpression(pEVar4);
    ::wasm::getLiteralsFromConstExpression((Expression *)&stack0xfffffffffffffd70);
    ::wasm::SmallVector<wasm::Literal,_1UL>::operator=
              ((SmallVector<wasm::Literal,_1UL> *)auStack_58,
               (SmallVector<wasm::Literal,_1UL> *)&stack0xfffffffffffffd70);
    ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&stack0xfffffffffffffd70);
  }
  pEVar4 = (Element *)::wasm::Element::operator[]((uint)s);
  parseOperation((Literals *)&stack0xfffffffffffffd70,this,pEVar4);
  ::wasm::SmallVector<wasm::Literal,_1UL>::operator=
            ((SmallVector<wasm::Literal,_1UL> *)auStack_98,
             (SmallVector<wasm::Literal,_1UL> *)&stack0xfffffffffffffd70);
  ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&stack0xfffffffffffffd70);
  poVar5 = std::operator<<((ostream *)&std::cerr,"seen ");
  ::wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
            (&local_108,(SmallVector<wasm::Literal,_1UL> *)auStack_98);
  poVar5 = (ostream *)::wasm::operator<<(poVar5,(Literals)in_stack_fffffffffffffd68);
  poVar5 = std::operator<<(poVar5,", expected ");
  ::wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
            (&local_d0,(SmallVector<wasm::Literal,_1UL> *)auStack_58);
  poVar5 = (ostream *)::wasm::operator<<(poVar5,(Literals)in_stack_fffffffffffffd68);
  std::operator<<(poVar5,'\n');
  ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_d0);
  ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_108);
  bVar1 = ::wasm::SmallVector<wasm::Literal,_1UL>::operator!=
                    ((SmallVector<wasm::Literal,_1UL> *)auStack_58,
                     (SmallVector<wasm::Literal,_1UL> *)auStack_98);
  if (!bVar1) {
    ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)auStack_58);
    ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)auStack_98);
    return;
  }
  ::wasm::Fatal::Fatal((Fatal *)&stack0xfffffffffffffd70);
  ::wasm::Fatal::operator<<
            ((Fatal *)&stack0xfffffffffffffd70,(char (*) [33])"unexpected, should be identical\n");
  ::wasm::Fatal::~Fatal((Fatal *)&stack0xfffffffffffffd70);
}

Assistant:

void parseAssertReturn(Element& s) {
    Literals actual;
    Literals expected;
    if (s.size() >= 3) {
      expected = getLiteralsFromConstExpression(
        builders[lastModule]->parseExpression(*s[2]));
    }
    [[maybe_unused]] bool trapped = false;
    try {
      actual = parseOperation(*s[1]);
    } catch (const TrapException&) {
      trapped = true;
    } catch (const WasmException& e) {
      std::cout << "[exception thrown: " << e << "]" << std::endl;
      trapped = true;
    }
    assert(!trapped);
    std::cerr << "seen " << actual << ", expected " << expected << '\n';
    if (expected != actual) {
      Fatal() << "unexpected, should be identical\n";
    }
  }